

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::Compiler::interface_variable_exists_in_entry_point(Compiler *this,uint32_t id)

{
  _Hash_node_base *p_Var1;
  uint32_t uVar2;
  SPIRVariable *pSVar3;
  __node_base_ptr p_Var4;
  TypedID<(diligent_spirv_cross::Types)2> *pTVar5;
  CompilerError *this_00;
  ulong __code;
  
  pSVar3 = Variant::get<diligent_spirv_cross::SPIRVariable>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id);
  uVar2 = ParsedIR::get_spirv_version(&this->ir);
  if (uVar2 < 0x10400) {
    if ((Input < pSVar3->storage) && (pSVar3->storage != Output)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Only Input, Output variables and Uniform constants are part of a shader linking interface."
                );
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->ir).entry_points._M_h._M_element_count < 2) {
      return true;
    }
  }
  __code = (ulong)(this->ir).default_entry_point.id;
  p_Var4 = ::std::
           _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->ir).entry_points._M_h,
                      __code % (this->ir).entry_points._M_h._M_bucket_count,
                      &(this->ir).default_entry_point,__code);
  p_Var1 = p_Var4->_M_nxt;
  pTVar5 = ::std::
           __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>const*,__gnu_cxx::__ops::_Iter_equals_val<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>const>>
                     (p_Var1[0xb]._M_nxt,
                      (long)&(p_Var1[0xb]._M_nxt)->_M_nxt + (long)p_Var1[0xc]._M_nxt * 4);
  return pTVar5 != (TypedID<(diligent_spirv_cross::Types)2> *)
                   ((long)&(p_Var1[0xb]._M_nxt)->_M_nxt + (long)p_Var1[0xc]._M_nxt * 4);
}

Assistant:

bool Compiler::interface_variable_exists_in_entry_point(uint32_t id) const
{
	auto &var = get<SPIRVariable>(id);

	if (ir.get_spirv_version() < 0x10400)
	{
		if (var.storage != StorageClassInput && var.storage != StorageClassOutput &&
		    var.storage != StorageClassUniformConstant)
			SPIRV_CROSS_THROW("Only Input, Output variables and Uniform constants are part of a shader linking interface.");

		// This is to avoid potential problems with very old glslang versions which did
		// not emit input/output interfaces properly.
		// We can assume they only had a single entry point, and single entry point
		// shaders could easily be assumed to use every interface variable anyways.
		if (ir.entry_points.size() <= 1)
			return true;
	}

	// In SPIR-V 1.4 and later, all global resource variables must be present.

	auto &execution = get_entry_point();
	return find(begin(execution.interface_variables), end(execution.interface_variables), VariableID(id)) !=
	       end(execution.interface_variables);
}